

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::detail::Type_Conversion_Base>
chaiscript::
make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Type_Conversion_Impl<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&,std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>const&>
          (Type_Info *arg,Type_Info *arg_1,
          function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *arg_2)

{
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *t_func;
  undefined8 uVar1;
  Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
  *this;
  Type_Info t_from;
  Type_Info t_to;
  void *pvVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> sVar3;
  Type_Conversion_Base *__p;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> *this_00;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *in_stack_ffffffffffffff38;
  function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff58;
  element_type *peVar4;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff7c;
  
  peVar4 = in_RDI;
  pvVar2 = operator_new(0x58);
  uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
  t_func = (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)in_RSI[2];
  __p = (Type_Conversion_Base *)*in_RSI;
  this_00 = (shared_ptr<chaiscript::detail::Type_Conversion_Base> *)in_RSI[1];
  uVar1 = in_RDX[2];
  this = (Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
          *)*in_RDX;
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::function
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  t_from.m_bare_type_info = (type_info *)in_stack_ffffffffffffff58;
  t_from.m_type_info = (type_info *)uVar1;
  t_from._16_8_ = in_RDI;
  t_to.m_bare_type_info = (type_info *)pvVar2;
  t_to.m_type_info = (type_info *)peVar4;
  t_to.m_flags = uVar5;
  t_to._20_4_ = in_stack_ffffffffffffff7c;
  detail::
  Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
  Type_Conversion_Impl(this,t_from,t_to,t_func);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::
  shared_ptr<chaiscript::detail::Type_Conversion_Base,void>(this_00,__p);
  std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>::~function
            ((function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> *)0x44bb9d);
  sVar3.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  return (shared_ptr<chaiscript::detail::Type_Conversion_Base>)
         sVar3.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }